

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O3

void __thiscall
spvtools::opt::LoopDescriptor::PopulateList(LoopDescriptor *this,IRContext *context,Function *f)

{
  pointer *pppLVar1;
  CFG *this_00;
  Instruction *pIVar2;
  _Rb_tree_color *p_Var3;
  iterator iVar4;
  BasicBlock *pBVar5;
  Loop *pLVar6;
  IRContext *pIVar7;
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,spvtools::opt::Loop*>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::Loop*>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *p_Var8;
  NodePtr pDVar9;
  NodePtr this_01;
  uint32_t uVar10;
  uint32_t uVar11;
  _Rb_tree_color _Var12;
  DominatorTree *this_02;
  Instruction *pIVar13;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar14;
  _Base_ptr p_Var15;
  BasicBlock *merge_target;
  BasicBlock *header;
  Loop *pLVar16;
  _Base_ptr p_Var17;
  pointer ppLVar18;
  DominatorTreeNode *loop_node;
  pointer ppLVar19;
  DominatorTreeNode *a;
  _Rb_tree_color *p_Var20;
  _Rb_tree_header *p_Var21;
  bool bVar22;
  LoopContainerType *__range2;
  Loop *current_loop;
  TreeDFIterator<spvtools::opt::DominatorTreeNode> __begin4;
  TreeDFIterator<spvtools::opt::DominatorTreeNode> __end4;
  PostOrderTreeDFIterator<spvtools::opt::DominatorTreeNode> __begin2;
  PostOrderTreeDFIterator<spvtools::opt::DominatorTreeNode> __end2;
  Loop *loop;
  Loop *local_320;
  IRContext *local_318;
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,spvtools::opt::Loop*>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::Loop*>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *local_310;
  BasicBlock *local_308;
  uint32_t local_300;
  Loop *local_2f8;
  df_iterator local_2f0;
  df_iterator local_298;
  post_iterator local_240;
  Loop *local_1e8;
  _Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
  local_1e0;
  post_iterator local_190;
  Loop *local_138;
  _Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
  local_130;
  Loop *local_e0;
  _Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
  local_d8;
  Loop *local_88;
  _Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
  local_80;
  
  local_318 = context;
  this_02 = (DominatorTree *)IRContext::GetDominatorAnalysis(context,f);
  ClearLoops(this);
  DominatorTree::post_begin(&local_240,this_02);
  DominatorTree::post_end(&local_190,this_02);
  local_e0 = (Loop *)local_240.current_;
  std::
  _Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
  ::_Deque_base(&local_d8,
                (_Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
                 *)&local_240.parent_iterators_);
  local_88 = (Loop *)local_190.current_;
  std::
  _Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
  ::_Deque_base(&local_80,
                (_Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
                 *)&local_190.parent_iterators_);
  std::
  _Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
  ::~_Deque_base((_Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
                  *)&local_190.parent_iterators_);
  std::
  _Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
  ::~_Deque_base((_Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
                  *)&local_240.parent_iterators_);
  local_190.current_ = (NodePtr)local_e0;
  std::
  deque<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
  ::deque(&local_190.parent_iterators_.c,
          (deque<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
           *)&local_d8);
  local_138 = local_88;
  std::
  deque<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
  ::deque((deque<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
           *)&local_130,
          (deque<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
           *)&local_80);
  if ((Loop *)local_190.current_ == local_138) {
LAB_00241c95:
    std::
    _Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
    ::~_Deque_base(&local_130);
    std::
    _Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
    ::~_Deque_base((_Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
                    *)&local_190.parent_iterators_);
    std::
    _Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
    ::~_Deque_base(&local_80);
    std::
    _Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
    ::~_Deque_base(&local_d8);
    ppLVar18 = (this->loops_).
               super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppLVar19 = (this->loops_).
               super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    if (ppLVar18 != ppLVar19) {
      do {
        local_e0 = *ppLVar18;
        if (local_e0->parent_ == (Loop *)0x0) {
          iVar4._M_current =
               (this->placeholder_top_loop_).nested_loops_.
               super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (this->placeholder_top_loop_).nested_loops_.
              super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>::
            _M_realloc_insert<spvtools::opt::Loop*const&>
                      ((vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>> *)
                       &(this->placeholder_top_loop_).nested_loops_,iVar4,&local_e0);
          }
          else {
            *iVar4._M_current = local_e0;
            pppLVar1 = &(this->placeholder_top_loop_).nested_loops_.
                        super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppLVar1 = *pppLVar1 + 1;
          }
        }
        ppLVar18 = ppLVar18 + 1;
      } while (ppLVar18 != ppLVar19);
    }
    return;
  }
  p_Var21 = &(this_02->nodes_)._M_t._M_impl.super__Rb_tree_header;
  local_310 = (_Hashtable<unsigned_int,std::pair<unsigned_int_const,spvtools::opt::Loop*>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::Loop*>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
               *)&this->basic_block_to_loop_;
LAB_002417c3:
  this_01 = local_190.current_;
  pIVar13 = BasicBlock::GetLoopMergeInst((BasicBlock *)(local_190.current_)->bb_);
  pIVar7 = local_318;
  if (pIVar13 != (Instruction *)0x0) {
    if ((local_318->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
      IRContext::BuildCFG(local_318);
    }
    this_00 = (pIVar7->cfg_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>.
              _M_t.
              super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
              .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl;
    pIVar2 = *(Instruction **)&((IRContext *)this_01->bb_)->grammar_;
    uVar10 = 0;
    if (pIVar2->has_result_id_ == true) {
      uVar10 = Instruction::GetSingleWordOperand(pIVar2,(uint)pIVar2->has_type_id_);
    }
    pvVar14 = CFG::preds(this_00,uVar10);
    p_Var3 = (pvVar14->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (p_Var20 = (pvVar14->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start; p_Var20 != p_Var3;
        p_Var20 = p_Var20 + 1) {
      p_Var15 = (this_02->nodes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (p_Var15 != (_Base_ptr)0x0) {
        _Var12 = *p_Var20;
        p_Var17 = &p_Var21->_M_header;
        do {
          bVar22 = p_Var15[1]._M_color < _Var12;
          if (!bVar22) {
            p_Var17 = p_Var15;
          }
          p_Var15 = (&p_Var15->_M_left)[bVar22];
        } while (p_Var15 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var17 != p_Var21) && (p_Var17[1]._M_color <= _Var12)) {
          pIVar2 = *(Instruction **)&((IRContext *)this_01->bb_)->grammar_;
          uVar10 = 0;
          if (pIVar2->has_result_id_ == true) {
            uVar10 = Instruction::GetSingleWordOperand(pIVar2,(uint)pIVar2->has_type_id_);
          }
          bVar22 = DominatorTree::Dominates(this_02,uVar10,_Var12);
          if (bVar22) {
            uVar10 = Instruction::GetSingleWordOperand(pIVar13,0);
            uVar11 = Instruction::GetSingleWordOperand(pIVar13,1);
            pIVar7 = local_318;
            if ((local_318->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
              IRContext::BuildCFG(local_318);
            }
            merge_target = CFG::block((pIVar7->cfg_)._M_t.
                                      super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
                                      .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>.
                                      _M_head_impl,uVar10);
            if ((pIVar7->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
              IRContext::BuildCFG(pIVar7);
            }
            local_308 = CFG::block((pIVar7->cfg_)._M_t.
                                   super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
                                   .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl,
                                   uVar11);
            header = IRContext::get_instr_block(pIVar7,pIVar13);
            pLVar16 = (Loop *)operator_new(0x90);
            Loop::Loop(pLVar16,pIVar7,(DominatorAnalysis *)this_02,header,local_308,merge_target);
            iVar4._M_current =
                 (this->loops_).
                 super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            local_320 = pLVar16;
            if (iVar4._M_current ==
                (this->loops_).
                super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>::
              _M_realloc_insert<spvtools::opt::Loop*const&>
                        ((vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>> *)this,
                         iVar4,&local_320);
              ppLVar18 = (this->loops_).
                         super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
            }
            else {
              *iVar4._M_current = pLVar16;
              ppLVar18 = (this->loops_).
                         super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish + 1;
              (this->loops_).
              super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppLVar18;
            }
            goto LAB_00241a9f;
          }
        }
      }
    }
  }
  goto LAB_00241c72;
LAB_00241a9f:
  ppLVar19 = ppLVar18 + -1;
  if (ppLVar19 !=
      (this->loops_).
      super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pLVar16 = ppLVar18[-2];
    ppLVar18 = ppLVar19;
    if (((pLVar16->parent_ == (Loop *)0x0) && (header != (BasicBlock *)0x0)) &&
       (pBVar5 = pLVar16->loop_header_, pBVar5 != (BasicBlock *)0x0)) {
      pIVar13 = (header->label_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      uVar10 = 0;
      if (pIVar13->has_result_id_ == true) {
        uVar10 = Instruction::GetSingleWordOperand(pIVar13,(uint)pIVar13->has_type_id_);
      }
      uVar11 = 0;
      pIVar13 = (pBVar5->label_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      if (pIVar13->has_result_id_ == true) {
        uVar11 = Instruction::GetSingleWordOperand(pIVar13,(uint)pIVar13->has_type_id_);
      }
      bVar22 = DominatorTree::Dominates(this_02,uVar10,uVar11);
      if (bVar22) {
        if ((merge_target != (BasicBlock *)0x0) &&
           (pBVar5 = pLVar16->loop_header_, pBVar5 != (BasicBlock *)0x0)) {
          pIVar13 = (merge_target->label_)._M_t.
                    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
          uVar10 = 0;
          if (pIVar13->has_result_id_ == true) {
            uVar10 = Instruction::GetSingleWordOperand(pIVar13,(uint)pIVar13->has_type_id_);
          }
          uVar11 = 0;
          pIVar13 = (pBVar5->label_)._M_t.
                    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
          if (pIVar13->has_result_id_ == true) {
            uVar11 = Instruction::GetSingleWordOperand(pIVar13,(uint)pIVar13->has_type_id_);
          }
          bVar22 = DominatorTree::Dominates(this_02,uVar10,uVar11);
          if (bVar22) goto LAB_00241a9f;
        }
        pLVar6 = local_320;
        local_240.current_ = (NodePtr)pLVar16;
        if (pLVar16->parent_ != (Loop *)0x0) {
          __assert_fail("!nested->GetParent() && \"The loop has another parent.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_descriptor.h"
                        ,0xaa,"void spvtools::opt::Loop::AddNestedLoop(Loop *)");
        }
        iVar4._M_current =
             (local_320->nested_loops_).
             super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (local_320->nested_loops_).
            super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>::
          _M_realloc_insert<spvtools::opt::Loop*const&>
                    ((vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>> *)
                     &local_320->nested_loops_,iVar4,(Loop **)&local_240);
        }
        else {
          *iVar4._M_current = pLVar16;
          pppLVar1 = &(local_320->nested_loops_).
                      super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppLVar1 = *pppLVar1 + 1;
        }
        *(Loop **)((long)local_240.current_ + 0x30) = pLVar6;
      }
    }
    goto LAB_00241a9f;
  }
  pIVar13 = (merge_target->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  _Var12 = _S_red;
  if (pIVar13->has_result_id_ == true) {
    _Var12 = Instruction::GetSingleWordOperand(pIVar13,(uint)pIVar13->has_type_id_);
  }
  p_Var15 = (this_02->nodes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var17 = &p_Var21->_M_header;
  if (p_Var15 != (_Base_ptr)0x0) {
    do {
      bVar22 = p_Var15[1]._M_color < _Var12;
      if (!bVar22) {
        p_Var17 = p_Var15;
      }
      p_Var15 = (&p_Var15->_M_left)[bVar22];
    } while (p_Var15 != (_Base_ptr)0x0);
    if ((_Rb_tree_header *)p_Var17 != p_Var21) {
      a = (DominatorTreeNode *)0x0;
      if (p_Var17[1]._M_color <= _Var12) {
        a = (DominatorTreeNode *)&p_Var17[1]._M_parent;
      }
      goto LAB_00241b09;
    }
  }
  a = (DominatorTreeNode *)0x0;
LAB_00241b09:
  DominatorTreeNode::df_begin(&local_2f0,this_01);
  DominatorTreeNode::df_end(&local_298,this_01);
  local_240.current_ = local_2f0.current_;
  std::
  _Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
  ::_Deque_base((_Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
                 *)&local_240.parent_iterators_,
                (_Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
                 *)&local_2f0.parent_iterators_);
  local_1e8 = (Loop *)local_298.current_;
  std::
  _Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
  ::_Deque_base(&local_1e0,
                (_Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
                 *)&local_298.parent_iterators_);
  std::
  _Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
  ::~_Deque_base((_Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
                  *)&local_298.parent_iterators_);
  std::
  _Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
  ::~_Deque_base((_Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
                  *)&local_2f0.parent_iterators_);
  local_2f0.current_ = local_240.current_;
  std::
  deque<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
  ::deque(&local_2f0.parent_iterators_.c,&local_240.parent_iterators_.c);
  local_298.current_ = (NodePtr)local_1e8;
  std::
  deque<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
  ::deque(&local_298.parent_iterators_.c,
          (deque<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
           *)&local_1e0);
  p_Var8 = local_310;
  if (local_2f0.current_ != local_298.current_) {
    do {
      pDVar9 = local_2f0.current_;
      bVar22 = DominatorTree::Dominates(this_02,a,local_2f0.current_);
      if (!bVar22) {
        Loop::AddBasicBlock(local_320,(BasicBlock *)pDVar9->bb_);
        pIVar13 = *(Instruction **)&((IRContext *)pDVar9->bb_)->grammar_;
        uVar10 = 0;
        if (pIVar13->has_result_id_ == true) {
          uVar10 = Instruction::GetSingleWordOperand(pIVar13,(uint)pIVar13->has_type_id_);
        }
        local_2f8 = local_320;
        local_300 = uVar10;
        std::
        _Hashtable<unsigned_int,std::pair<unsigned_int_const,spvtools::opt::Loop*>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::Loop*>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<std::pair<unsigned_int,spvtools::opt::Loop*>>(p_Var8);
      }
      TreeDFIterator<spvtools::opt::DominatorTreeNode>::operator++(&local_2f0);
    } while (local_2f0.current_ != local_298.current_);
  }
  std::
  _Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
  ::~_Deque_base((_Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
                  *)&local_298.parent_iterators_);
  std::
  _Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
  ::~_Deque_base((_Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
                  *)&local_2f0.parent_iterators_);
  std::
  _Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
  ::~_Deque_base(&local_1e0);
  std::
  _Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
  ::~_Deque_base((_Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
                  *)&local_240.parent_iterators_);
LAB_00241c72:
  PostOrderTreeDFIterator<spvtools::opt::DominatorTreeNode>::operator++(&local_190);
  if ((Loop *)local_190.current_ == local_138) goto LAB_00241c95;
  goto LAB_002417c3;
}

Assistant:

void LoopDescriptor::PopulateList(IRContext* context, const Function* f) {
  DominatorAnalysis* dom_analysis = context->GetDominatorAnalysis(f);

  ClearLoops();

  // Post-order traversal of the dominator tree to find all the OpLoopMerge
  // instructions.
  DominatorTree& dom_tree = dom_analysis->GetDomTree();
  for (DominatorTreeNode& node :
       make_range(dom_tree.post_begin(), dom_tree.post_end())) {
    Instruction* merge_inst = node.bb_->GetLoopMergeInst();
    if (merge_inst) {
      bool all_backedge_unreachable = true;
      for (uint32_t pid : context->cfg()->preds(node.bb_->id())) {
        if (dom_analysis->IsReachable(pid) &&
            dom_analysis->Dominates(node.bb_->id(), pid)) {
          all_backedge_unreachable = false;
          break;
        }
      }
      if (all_backedge_unreachable)
        continue;  // ignore this one, we actually never branch back.

      // The id of the merge basic block of this loop.
      uint32_t merge_bb_id = merge_inst->GetSingleWordOperand(0);

      // The id of the continue basic block of this loop.
      uint32_t continue_bb_id = merge_inst->GetSingleWordOperand(1);

      // The merge target of this loop.
      BasicBlock* merge_bb = context->cfg()->block(merge_bb_id);

      // The continue target of this loop.
      BasicBlock* continue_bb = context->cfg()->block(continue_bb_id);

      // The basic block containing the merge instruction.
      BasicBlock* header_bb = context->get_instr_block(merge_inst);

      // Add the loop to the list of all the loops in the function.
      Loop* current_loop =
          new Loop(context, dom_analysis, header_bb, continue_bb, merge_bb);
      loops_.push_back(current_loop);

      // We have a bottom-up construction, so if this loop has nested-loops,
      // they are by construction at the tail of the loop list.
      for (auto itr = loops_.rbegin() + 1; itr != loops_.rend(); ++itr) {
        Loop* previous_loop = *itr;

        // If the loop already has a parent, then it has been processed.
        if (previous_loop->HasParent()) continue;

        // If the current loop does not dominates the previous loop then it is
        // not nested loop.
        if (!dom_analysis->Dominates(header_bb,
                                     previous_loop->GetHeaderBlock()))
          continue;
        // If the current loop merge dominates the previous loop then it is
        // not nested loop.
        if (dom_analysis->Dominates(merge_bb, previous_loop->GetHeaderBlock()))
          continue;

        current_loop->AddNestedLoop(previous_loop);
      }
      DominatorTreeNode* dom_merge_node = dom_tree.GetTreeNode(merge_bb);
      for (DominatorTreeNode& loop_node :
           make_range(node.df_begin(), node.df_end())) {
        // Check if we are in the loop.
        if (dom_tree.Dominates(dom_merge_node, &loop_node)) continue;
        current_loop->AddBasicBlock(loop_node.bb_);
        basic_block_to_loop_.insert(
            std::make_pair(loop_node.bb_->id(), current_loop));
      }
    }
  }
  for (Loop* loop : loops_) {
    if (!loop->HasParent()) placeholder_top_loop_.nested_loops_.push_back(loop);
  }
}